

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt,xmlNodePtr tree)

{
  int iVar1;
  xmlXIncludeRefPtr pxVar2;
  int local_30;
  int start;
  int i;
  int ret;
  xmlNodePtr cur;
  xmlXIncludeRefPtr ref;
  xmlNodePtr tree_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  start = 0;
  local_30 = ctxt->incNr;
  _i = tree;
  do {
    iVar1 = xmlXIncludeTestNode(ctxt,_i);
    if (iVar1 == 1) {
      pxVar2 = xmlXIncludeExpandNode(ctxt,_i);
      if (pxVar2 != (xmlXIncludeRefPtr)0x0) {
        pxVar2->replace = 1;
      }
LAB_00219091:
      do {
        if (_i == tree) break;
        if (_i->next != (_xmlNode *)0x0) {
          _i = _i->next;
          break;
        }
        _i = _i->parent;
      } while (_i != (xmlNodePtr)0x0);
    }
    else {
      if ((_i->children == (_xmlNode *)0x0) ||
         ((_i->type != XML_DOCUMENT_NODE && (_i->type != XML_ELEMENT_NODE)))) goto LAB_00219091;
      _i = _i->children;
    }
    if (_i == (xmlNodePtr)0x0 || _i == tree) {
      for (; local_30 < ctxt->incNr; local_30 = local_30 + 1) {
        if (ctxt->incTab[local_30]->replace == 0) {
          if (ctxt->incTab[local_30]->inc != (xmlNodePtr)0x0) {
            xmlFreeNodeList(ctxt->incTab[local_30]->inc);
            ctxt->incTab[local_30]->inc = (xmlNodePtr)0x0;
          }
        }
        else {
          xmlXIncludeIncludeNode(ctxt,ctxt->incTab[local_30]);
          ctxt->incTab[local_30]->replace = 0;
        }
        start = start + 1;
      }
      if (ctxt->isStream != 0) {
        for (local_30 = 0; local_30 < ctxt->incNr; local_30 = local_30 + 1) {
          xmlXIncludeFreeRef(ctxt->incTab[local_30]);
        }
        ctxt->incNr = 0;
      }
      return start;
    }
  } while( true );
}

Assistant:

static int
xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt, xmlNodePtr tree) {
    xmlXIncludeRefPtr ref;
    xmlNodePtr cur;
    int ret = 0;
    int i, start;

    /*
     * First phase: lookup the elements in the document
     */
    start = ctxt->incNr;
    cur = tree;
    do {
	/* TODO: need to work on entities -> stack */
        if (xmlXIncludeTestNode(ctxt, cur) == 1) {
            ref = xmlXIncludeExpandNode(ctxt, cur);
            /*
             * Mark direct includes.
             */
            if (ref != NULL)
                ref->replace = 1;
        } else if ((cur->children != NULL) &&
                   ((cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_ELEMENT_NODE))) {
            cur = cur->children;
            continue;
        }
        do {
            if (cur == tree)
                break;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
            cur = cur->parent;
        } while (cur != NULL);
    } while ((cur != NULL) && (cur != tree));

    /*
     * Second phase: extend the original document infoset.
     */
    for (i = start; i < ctxt->incNr; i++) {
	if (ctxt->incTab[i]->replace != 0) {
            xmlXIncludeIncludeNode(ctxt, ctxt->incTab[i]);
            ctxt->incTab[i]->replace = 0;
        } else {
            /*
             * Ignore includes which were added indirectly, for example
             * inside xi:fallback elements.
             */
            if (ctxt->incTab[i]->inc != NULL) {
                xmlFreeNodeList(ctxt->incTab[i]->inc);
                ctxt->incTab[i]->inc = NULL;
            }
        }
	ret++;
    }

    if (ctxt->isStream) {
        /*
         * incTab references nodes which will eventually be deleted in
         * streaming mode. The table is only required for XPointer
         * expressions which aren't allowed in streaming mode.
         */
        for (i = 0;i < ctxt->incNr;i++) {
            xmlXIncludeFreeRef(ctxt->incTab[i]);
        }
        ctxt->incNr = 0;
    }

    return(ret);
}